

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf.c
# Opt level: O0

uint fl_utf8towc(char *src,uint srclen,wchar_t *dst,uint dstlen)

{
  uint uVar1;
  wchar_t local_50;
  wchar_t local_4c;
  wchar_t len_1;
  uint ucs;
  wchar_t len;
  uint count;
  char *e;
  char *p;
  wchar_t *pwStack_28;
  uint dstlen_local;
  wchar_t *dst_local;
  char *pcStack_18;
  uint srclen_local;
  char *src_local;
  
  _len = src + srclen;
  ucs = 0;
  uVar1 = ucs;
  e = src;
  p._4_4_ = dstlen;
  pwStack_28 = dst;
  dst_local._4_4_ = srclen;
  pcStack_18 = src;
  if (dstlen != 0) {
    do {
      ucs = uVar1;
      if (_len <= e) {
        pwStack_28[ucs] = L'\0';
        return ucs;
      }
      if (((int)*e & 0x80U) == 0) {
        pwStack_28[ucs] = (int)*e;
        e = e + 1;
      }
      else {
        local_4c = fl_utf8decode(e,_len,&len_1);
        e = e + len_1;
        pwStack_28[ucs] = local_4c;
      }
      uVar1 = ucs + 1;
    } while (uVar1 != p._4_4_);
    pwStack_28[ucs] = L'\0';
    ucs = uVar1;
  }
  while (e < _len) {
    if (((int)*e & 0x80U) == 0) {
      e = e + 1;
    }
    else {
      fl_utf8decode(e,_len,&local_50);
      e = e + local_50;
    }
    ucs = ucs + 1;
  }
  return ucs;
}

Assistant:

unsigned fl_utf8towc(const char* src, unsigned srclen,
		  wchar_t* dst, unsigned dstlen)
{
#if defined(WIN32) || defined(__CYGWIN__)
  return fl_utf8toUtf16(src, srclen, (unsigned short*)dst, dstlen);
#else
  const char* p = src;
  const char* e = src+srclen;
  unsigned count = 0;
  if (dstlen) for (;;) {
    if (p >= e) {
      dst[count] = 0;
      return count;
    }
    if (!(*p & 0x80)) { /* ascii */
      dst[count] = *p++;
    } else {
      int len; unsigned ucs = fl_utf8decode(p,e,&len);
      p += len;
      dst[count] = (wchar_t)ucs;
    }
    if (++count == dstlen) {dst[count-1] = 0; break;}
  }
  /* we filled dst, measure the rest: */
  while (p < e) {
    if (!(*p & 0x80)) p++;
    else {
      int len; fl_utf8decode(p,e,&len);
      p += len;
    }
    ++count;
  }
  return count;
#endif
}